

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMutex.h
# Opt level: O3

void __thiscall liblogger::LogMutex::LogMutex(LogMutex *this)

{
  int iVar1;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_c;
  
  iVar1 = pthread_mutexattr_init(&local_c);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype(&local_c,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)this,&local_c);
      if (iVar1 == 0) {
        iVar1 = pthread_mutexattr_destroy(&local_c);
        if (iVar1 == 0) {
          return;
        }
      }
    }
  }
  abort();
}

Assistant:

LogMutex() {
				pthread_mutexattr_t attr;
				if (pthread_mutexattr_init(&attr) != 0)
					abort();

				if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE) != 0)
					abort();

				if (pthread_mutex_init(&m_mutex, &attr) != 0)
					abort();

				if (pthread_mutexattr_destroy(&attr) != 0)
					abort();
			}